

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

void __thiscall tst_RootIndexProxyModel::insertRow(tst_RootIndexProxyModel *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  QList<QVariant> arguments;
  Data *local_280;
  QVariant *local_278;
  QAbstractItemModel *pQStack_270;
  RootIndexProxyModel proxyModel;
  QModelIndex local_250;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  QSignalSpy proxyRowsAboutToBeInsertedSpy;
  QSignalSpy proxyRowsInsertedSpy;
  QSignalSpy sourceRowsInsertedSpy;
  QSignalSpy sourceRowsAboutToBeInsertedSpy;
  
  parent = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,(QObject *)parent);
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  proxyRowsInsertedSpy.super_QObject = (QObject)0xff;
  proxyRowsInsertedSpy._1_7_ = 0xffffffffffffff;
  proxyRowsInsertedSpy._8_8_ = 0;
  proxyRowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  (**(code **)(*(long *)parent + 0x60))(&proxyRowsAboutToBeInsertedSpy,parent,1,0);
  RootIndexProxyModel::setRootIndex((QModelIndex *)&proxyModel);
  QSignalSpy::QSignalSpy
            (&proxyRowsAboutToBeInsertedSpy,(QObject *)&proxyModel,
             "2rowsAboutToBeInserted(QModelIndex, int, int)");
  cVar1 = QTest::qVerify(proxyRowsAboutToBeInsertedSpy.sig.d.size != 0,
                         "proxyRowsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xa1);
  if (cVar1 != '\0') {
    QSignalSpy::QSignalSpy
              (&proxyRowsInsertedSpy,(QObject *)&proxyModel,"2rowsInserted(QModelIndex, int, int)");
    cVar1 = QTest::qVerify(proxyRowsInsertedSpy.sig.d.size != 0,"proxyRowsInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0xa3);
    if (cVar1 != '\0') {
      QSignalSpy::QSignalSpy
                (&sourceRowsAboutToBeInsertedSpy,(QObject *)parent,
                 "2rowsAboutToBeInserted(QModelIndex, int, int)");
      cVar1 = QTest::qVerify(sourceRowsAboutToBeInsertedSpy.sig.d.size != 0,
                             "sourceRowsAboutToBeInsertedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0xa5);
      if (cVar1 != '\0') {
        QSignalSpy::QSignalSpy
                  (&sourceRowsInsertedSpy,(QObject *)parent,"2rowsInserted(QModelIndex, int, int)");
        cVar1 = QTest::qVerify(sourceRowsInsertedSpy.sig.d.size != 0,
                               "sourceRowsInsertedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0xa7);
        if (cVar1 != '\0') {
          local_280 = (Data *)0xffffffffffffffff;
          local_278 = (QVariant *)0x0;
          pQStack_270 = (QAbstractItemModel *)0x0;
          (**(code **)(*(long *)parent + 0x60))(&arguments,parent,1,0);
          iVar3 = (**(code **)(*(long *)parent + 0x78))(parent,&arguments);
          arguments.d.d = (Data *)0xffffffffffffffff;
          arguments.d.ptr = (QVariant *)0x0;
          arguments.d.size = 0;
          iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)&proxyModel);
          cVar1 = QTest::qCompare(iVar3,iVar4,"oldRowCount","proxyModel.rowCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0xa9);
          if (cVar1 != '\0') {
            arguments.d.d = (Data *)0xffffffffffffffff;
            arguments.d.ptr = (QVariant *)0x0;
            arguments.d.size = 0;
            RootIndexProxyModel::insertRows((int)&proxyModel,1,(QModelIndex *)0x1);
            arguments.d.d = (Data *)0xffffffffffffffff;
            arguments.d.ptr = (QVariant *)0x0;
            arguments.d.size = 0;
            iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)&proxyModel);
            cVar1 = QTest::qCompare(iVar3 + 1,iVar4,"oldRowCount + 1","proxyModel.rowCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0xab);
            if (cVar1 != '\0') {
              local_280 = (Data *)0xffffffffffffffff;
              local_278 = (QVariant *)0x0;
              pQStack_270 = (QAbstractItemModel *)0x0;
              (**(code **)(*(long *)parent + 0x60))(&arguments,parent,1,0);
              iVar4 = (**(code **)(*(long *)parent + 0x78))(parent,&arguments);
              cVar1 = QTest::qCompare(iVar3 + 1,iVar4,"oldRowCount + 1",
                                      "baseModel->rowCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0xac);
              if (cVar1 != '\0') {
                cVar1 = QTest::qCompare(proxyRowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.
                                        d.size,1,"proxyRowsAboutToBeInsertedSpy.count()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                        ,0xad);
                if (cVar1 != '\0') {
                  QList<QList<QVariant>_>::takeFirst
                            (&arguments,&proxyRowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>
                            );
                  qvariant_cast<QModelIndex>((QModelIndex *)&local_280,arguments.d.ptr);
                  local_250.r = -1;
                  local_250.c = -1;
                  local_250.i = 0;
                  local_250.m = (QAbstractItemModel *)0x0;
                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                    ((QModelIndex *)&local_280,&local_250,
                                     "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0xaf);
                  if (bVar2) {
                    iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                    cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0xb0);
                    if (cVar1 != '\0') {
                      iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                      cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0xb1);
                      if (cVar1 != '\0') {
                        cVar1 = QTest::qCompare(proxyRowsInsertedSpy.super_QList<QList<QVariant>_>.d
                                                .size,1,"proxyRowsInsertedSpy.count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                ,0xb2);
                        if (cVar1 != '\0') {
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)&local_280,
                                     &proxyRowsInsertedSpy.super_QList<QList<QVariant>_>);
                          QArrayDataPointer<QVariant>::operator=
                                    (&arguments.d,(QArrayDataPointer<QVariant> *)&local_280);
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_280);
                          qvariant_cast<QModelIndex>((QModelIndex *)&local_280,arguments.d.ptr);
                          local_250.r = -1;
                          local_250.c = -1;
                          local_250.i = 0;
                          local_250.m = (QAbstractItemModel *)0x0;
                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                            ((QModelIndex *)&local_280,&local_250,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0xb4);
                          if (bVar2) {
                            iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                            cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb5);
                            if (cVar1 != '\0') {
                              iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                              cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb6);
                              if (cVar1 != '\0') {
                                cVar1 = QTest::qCompare(sourceRowsAboutToBeInsertedSpy.
                                                        super_QList<QList<QVariant>_>.d.size,1,
                                                        "sourceRowsAboutToBeInsertedSpy.count()","1"
                                                        ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb7);
                                if (cVar1 != '\0') {
                                  QList<QList<QVariant>_>::takeFirst
                                            ((value_type *)&local_280,
                                             &sourceRowsAboutToBeInsertedSpy.
                                              super_QList<QList<QVariant>_>);
                                  QArrayDataPointer<QVariant>::operator=
                                            (&arguments.d,(QArrayDataPointer<QVariant> *)&local_280)
                                  ;
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_280);
                                  qvariant_cast<QModelIndex>
                                            ((QModelIndex *)&local_280,arguments.d.ptr);
                                  local_238 = 0xffffffffffffffff;
                                  local_230 = 0;
                                  uStack_228 = 0;
                                  (**(code **)(*(long *)parent + 0x60))(&local_250,parent,1,0);
                                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    ((QModelIndex *)&local_280,&local_250,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xb9);
                                  if (bVar2) {
                                    iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                                    cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xba);
                                    if (cVar1 != '\0') {
                                      iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                                      cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbb);
                                      if (cVar1 != '\0') {
                                        cVar1 = QTest::qCompare(sourceRowsInsertedSpy.
                                                                super_QList<QList<QVariant>_>.d.size
                                                                ,1,"sourceRowsInsertedSpy.count()",
                                                                "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbc);
                                        if (cVar1 != '\0') {
                                          QList<QList<QVariant>_>::takeFirst
                                                    ((value_type *)&local_280,
                                                     &sourceRowsInsertedSpy.
                                                      super_QList<QList<QVariant>_>);
                                          QArrayDataPointer<QVariant>::operator=
                                                    (&arguments.d,
                                                     (QArrayDataPointer<QVariant> *)&local_280);
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_280);
                                          qvariant_cast<QModelIndex>
                                                    ((QModelIndex *)&local_280,arguments.d.ptr);
                                          local_238 = 0xffffffffffffffff;
                                          local_230 = 0;
                                          uStack_228 = 0;
                                          (**(code **)(*(long *)parent + 0x60))
                                                    (&local_250,parent,1,0);
                                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            ((QModelIndex *)&local_280,&local_250,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbe);
                                          if (bVar2) {
                                            iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                                            cVar1 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xbf);
                                            if (cVar1 != '\0') {
                                              iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                                              cVar1 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xc0);
                                              if (cVar1 != '\0') {
                                                QObject::deleteLater();
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  QArrayDataPointer<QVariant>::~QArrayDataPointer(&arguments.d);
                }
              }
            }
          }
        }
        QSignalSpy::~QSignalSpy(&sourceRowsInsertedSpy);
      }
      QSignalSpy::~QSignalSpy(&sourceRowsAboutToBeInsertedSpy);
    }
    QSignalSpy::~QSignalSpy(&proxyRowsInsertedSpy);
  }
  QSignalSpy::~QSignalSpy(&proxyRowsAboutToBeInsertedSpy);
  RootIndexProxyModel::~RootIndexProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_RootIndexProxyModel::insertRow()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyRowsAboutToBeInsertedSpy(&proxyModel, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxyRowsInsertedSpy(&proxyModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsInsertedSpy.isValid());
    QSignalSpy sourceRowsAboutToBeInsertedSpy(baseModel, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(sourceRowsAboutToBeInsertedSpy.isValid());
    QSignalSpy sourceRowsInsertedSpy(baseModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(sourceRowsInsertedSpy.isValid());
    int oldRowCount = baseModel->rowCount(baseModel->index(1, 0));
    QCOMPARE(oldRowCount, proxyModel.rowCount());
    proxyModel.insertRows(1, 1);
    QCOMPARE(oldRowCount + 1, proxyModel.rowCount());
    QCOMPARE(oldRowCount + 1, baseModel->rowCount(baseModel->index(1, 0)));
    QCOMPARE(proxyRowsAboutToBeInsertedSpy.count(), 1);
    QList<QVariant> arguments = proxyRowsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyRowsInsertedSpy.count(), 1);
    arguments = proxyRowsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsAboutToBeInsertedSpy.count(), 1);
    arguments = sourceRowsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsInsertedSpy.count(), 1);
    arguments = sourceRowsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}